

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O1

void __thiscall
sjtu::FileManager<sjtu::TrainManager::stationNameType>::save
          (FileManager<sjtu::TrainManager::stationNameType> *this,locType *offset)

{
  Node *pNVar1;
  long lVar2;
  Node *pNVar3;
  
  pNVar1 = (((this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).cache)->table).nil;
  pNVar3 = pNVar1->left;
  if (pNVar3 != pNVar1) {
    do {
      lVar2 = pNVar3->value->first;
      if (lVar2 == *offset) break;
      pNVar3 = (&pNVar3->left)[lVar2 <= *offset];
    } while (pNVar3 != pNVar1);
  }
  pNVar3->value->second->is_dirty_page = true;
  return;
}

Assistant:

virtual void save(const locType &offset) override {cache -> dirty_page_set(offset);}